

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Lf_Cut_t * Lf_ObjCutBestNew(Lf_Man_t *p,int i,Lf_Cut_t *pCut)

{
  int iVar1;
  Lf_Bst_t *p_00;
  int Index;
  Lf_Bst_t *pBest;
  Lf_Cut_t *pCut_local;
  int i_local;
  Lf_Man_t *p_local;
  
  p_00 = Lf_ObjReadBest(p,i);
  iVar1 = Lf_BestCutIndex(p_00);
  pCut->Delay = p_00->Delay[iVar1];
  pCut->Flow = p_00->Flow[iVar1];
  if (iVar1 == 2) {
    p_local = (Lf_Man_t *)Lf_MemLoadMuxCut(p,i,pCut);
  }
  else {
    p_local = (Lf_Man_t *)Lf_MemLoadCut(&p->vStoreNew,(uint)p_00->Cut[iVar1] >> 1,i,pCut,0,0);
  }
  return (Lf_Cut_t *)p_local;
}

Assistant:

static inline Lf_Cut_t * Lf_ObjCutBestNew( Lf_Man_t * p, int i, Lf_Cut_t * pCut )
{
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, i );
    int Index = Lf_BestCutIndex( pBest );
    pCut->Delay = pBest->Delay[Index];
    pCut->Flow  = pBest->Flow[Index];
    if ( Index == 2 )
        return Lf_MemLoadMuxCut( p, i, pCut );
    return Lf_MemLoadCut( &p->vStoreNew, pBest->Cut[Index].Handle, i, pCut, 0, 0 );
}